

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

void nn_req_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  nn_req *req;
  long local_28;
  
  if (in_RDI == 0) {
    local_28 = 0;
  }
  else {
    local_28 = in_RDI + -800;
  }
  if (in_ESI == 0xfffffffe && in_EDX == 0xfffffffd) {
    nn_timer_stop((nn_timer *)0x13f115);
    *(undefined4 *)(local_28 + 0x378) = 9;
  }
  if (*(int *)(local_28 + 0x378) == 9) {
    iVar1 = nn_timer_isidle((nn_timer *)0x13f158);
    if (iVar1 != 0) {
      *(undefined4 *)(local_28 + 0x378) = 1;
      nn_fsm_stopped_noevent((nn_fsm *)0x13f182);
      nn_sockbase_stopped((nn_sockbase *)0x13f18c);
    }
    return;
  }
  nn_backtrace_print();
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
          (ulong)*(uint *)(local_28 + 0x378),(ulong)in_ESI,(ulong)in_EDX,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
          ,0x154);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_req_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_req *req;

    req = nn_cont (self, struct nn_req, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        nn_timer_stop (&req->task.timer);
        req->state = NN_REQ_STATE_STOPPING;
    }
    if (nn_slow (req->state == NN_REQ_STATE_STOPPING)) {
        if (!nn_timer_isidle (&req->task.timer))
            return;
        req->state = NN_REQ_STATE_IDLE;
        nn_fsm_stopped_noevent (&req->fsm);
        nn_sockbase_stopped (&req->xreq.sockbase);
        return;
    }

    nn_fsm_bad_state(req->state, src, type);
}